

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library.cpp
# Opt level: O2

Book * __thiscall
Library::checkout_book(Book *__return_storage_ptr__,Library *this,Patron *patron,string *isbn)

{
  Book *pBVar1;
  __type_conflict _Var2;
  undefined8 uVar3;
  Book *this_00;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = *(Book **)&this->books;
  pBVar1 = *(Book **)&this->field_0x20;
  while( true ) {
    if (this_00 == pBVar1) {
      std::operator+(&local_50,"Error in Library::checkout_book() - Book with ISBN=",isbn);
      std::operator+(&local_70,&local_50," not found.");
      error(&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      uVar3 = std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      _Unwind_Resume(uVar3);
    }
    Book::get_isbn_abi_cxx11_(&local_70,this_00);
    _Var2 = std::operator==(&local_70,isbn);
    std::__cxx11::string::~string((string *)&local_70);
    if (_Var2) break;
    this_00 = this_00 + 1;
  }
  checkout_book(__return_storage_ptr__,this,patron,this_00);
  return __return_storage_ptr__;
}

Assistant:

Book Library::checkout_book(const Patron& patron, const std::string& isbn)
{
	for (const auto& book : books)
		if (book.get_isbn() == isbn)
			return checkout_book(patron, book);
	error("Error in Library::checkout_book() - Book with ISBN="
		+ isbn + " not found.");
}